

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::Convolution1D_x86_avx2::create_pipeline(Convolution1D_x86_avx2 *this,Option *opt)

{
  uint _c;
  int iVar1;
  _func_int **pp_Var2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  int _h;
  undefined4 *puVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  undefined4 *puVar9;
  uint uVar10;
  _func_int *p_Var11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  undefined4 *puVar16;
  long lVar17;
  ulong uVar18;
  int i;
  ulong uVar19;
  uint uVar20;
  Mat local_78;
  
  p_Var11 = this->_vptr_Convolution1D_x86_avx2[-3];
  if (*(int *)(&this->field_0x140 + (long)p_Var11) == 0) {
    _c = *(uint *)(&this->field_0xd0 + (long)p_Var11);
    uVar18 = (long)*(int *)(&this->field_0xf0 + (long)p_Var11) /
             (long)*(int *)(&this->field_0xd4 + (long)p_Var11);
    uVar18 = (long)((ulong)(uint)((int)uVar18 >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
             (long)(int)_c;
    _h = (int)uVar18;
    uVar20 = 1;
    uVar10 = 1;
    if (opt->use_packing_layout == true) {
      uVar20 = (uint)((uVar18 & 3) == 0) * 3 + 1;
      if ((uVar18 & 7) == 0) {
        uVar20 = 8;
      }
      uVar10 = (uint)((_c & 3) == 0) * 3 + 1;
      if ((_c & 7) == 0) {
        uVar10 = 8;
      }
    }
    Mat::reshape(&local_78,(Mat *)(&this->field_0x148 + (long)p_Var11),
                 *(int *)(&this->field_0xd4 + (long)p_Var11),_h,_c,(Allocator *)0x0);
    Mat::create(&this->weight_data_packed,
                *(int *)(&this->field_0xd4 + (long)this->_vptr_Convolution1D_x86_avx2[-3]),
                (int)((long)((ulong)(uint)(_h >> 0x1f) << 0x20 | uVar18 & 0xffffffff) /
                     (long)(int)uVar20),
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86_avx2[-3]) /
                (int)uVar10,(ulong)(uVar10 * uVar20 * 4),uVar10 * uVar20,(Allocator *)0x0);
    uVar18 = (ulong)uVar10;
    pp_Var2 = this->_vptr_Convolution1D_x86_avx2;
    p_Var11 = pp_Var2[-3];
    if ((int)uVar10 <= *(int *)(&this->field_0xd0 + (long)p_Var11)) {
      uVar15 = (ulong)uVar20;
      iVar1 = (this->weight_data_packed).w;
      pvVar3 = (this->weight_data_packed).data;
      sVar4 = (this->weight_data_packed).elemsize;
      sVar5 = (this->weight_data_packed).cstep;
      uVar13 = 0;
      do {
        if ((int)uVar20 <= _h) {
          puVar7 = (undefined4 *)(local_78.cstep * local_78.elemsize * uVar13 + (long)local_78.data)
          ;
          uVar12 = 0;
          do {
            if (0 < *(int *)(&this->field_0xd4 + (long)p_Var11)) {
              puVar6 = (undefined4 *)
                       ((long)pvVar3 +
                       (long)(int)((uVar12 & 0xffffffff) / (ulong)uVar20) * (long)iVar1 * sVar4 +
                       (long)(int)((uVar13 & 0xffffffff) / uVar18) * sVar5 * sVar4);
              lVar17 = 0;
              puVar16 = puVar7;
              do {
                uVar19 = 0;
                puVar9 = puVar16;
                uVar14 = uVar18;
                puVar8 = puVar16;
                do {
                  do {
                    *puVar6 = *puVar9;
                    puVar6 = puVar6 + 1;
                    uVar14 = uVar14 - 1;
                    puVar9 = (undefined4 *)((long)puVar9 + local_78.cstep * local_78.elemsize);
                  } while (uVar14 != 0);
                  uVar19 = uVar19 + 1;
                  puVar9 = (undefined4 *)((long)puVar8 + (long)local_78.w * local_78.elemsize);
                  uVar14 = uVar18;
                  puVar8 = puVar9;
                } while (uVar19 != uVar15);
                lVar17 = lVar17 + 1;
                p_Var11 = pp_Var2[-3];
                puVar16 = puVar16 + 1;
              } while (lVar17 < *(int *)(&this->field_0xd4 + (long)p_Var11));
            }
            uVar12 = uVar12 + uVar15;
            puVar7 = (undefined4 *)((long)puVar7 + (long)local_78.w * local_78.elemsize * uVar15);
          } while ((long)uVar12 < (long)((long)_h - (ulong)(uVar20 - 1)));
        }
        uVar13 = uVar13 + uVar18;
      } while ((long)((uVar10 - 1) + uVar13) < (long)*(int *)(&this->field_0xd0 + (long)p_Var11));
    }
    if (local_78.refcount != (int *)0x0) {
      LOCK();
      *local_78.refcount = *local_78.refcount + -1;
      UNLOCK();
      if (*local_78.refcount == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  return 0;
}

Assistant:

int Convolution1D_x86_avx2::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    int num_input = weight_data_size / kernel_w / num_output;

    int elempack = 1;
    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    // src = kw-inch-outch
    // dst = pb-pa-kw-inch/pa-outch/pb
    {
        Mat weight_data_r2 = weight_data.reshape(kernel_w, num_input, num_output);

        weight_data_packed.create(kernel_w, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            Mat g0 = weight_data_packed.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                float* g00 = g0.row(p / elempack);

                for (int k = 0; k < kernel_w; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    return 0;
}